

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O1

void __thiscall
mserialize::detail::visit_enum<binlog::ToStringVisitor,binlog::Range>
          (detail *this,string_view tag,ToStringVisitor *visitor,Range *istream)

{
  detail *pdVar1;
  detail *pdVar2;
  char *pcVar3;
  detail tag_00;
  Enum e;
  bool bVar4;
  undefined1 *puVar5;
  runtime_error *this_00;
  long *plVar6;
  ulong uVar7;
  long *plVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  detail *pdVar15;
  char *pcVar16;
  char *pcVar17;
  detail *pdVar18;
  IntegerToHex hex;
  IntegerToHex local_d0;
  detail *local_b0;
  detail *local_a8;
  ulong uStack_a0;
  detail *local_98;
  char *pcStack_90;
  detail local_88;
  undefined7 uStack_87;
  char *pcStack_80;
  undefined1 *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pdVar18 = (detail *)(ulong)(tag._ptr != (char *)0x0);
  pdVar1 = this + (long)pdVar18;
  lVar11 = (long)tag._ptr - (long)pdVar18;
  uVar14 = 0;
  if (lVar11 != 0) {
    uVar14 = lVar11 - 1U;
  }
  if (lVar11 == 0 || lVar11 - 1U == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pdVar1,pdVar1 + uVar14);
    std::operator+(&local_50,"Invalid enum tag: \'",&local_70);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_d0._buffer._0_8_ = *plVar6;
    plVar8 = plVar6 + 2;
    if ((long *)local_d0._buffer._0_8_ == plVar8) {
      local_d0._16_8_ = *plVar8;
      local_d0._p = (char *)plVar6[3];
      local_d0._buffer._0_8_ = local_d0._buffer + 0x10;
    }
    else {
      local_d0._16_8_ = *plVar8;
    }
    local_d0._buffer._8_8_ = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::runtime_error::runtime_error(this_00,(string *)&local_d0);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tag_00 = *pdVar1;
  local_d0._p = local_d0._buffer + 0x13;
  visit_arithmetic<mserialize::detail::IntegerToHex,binlog::Range>
            ((char)tag_00,&local_d0,(Range *)visitor);
  pcVar13 = local_d0._p;
  uVar12 = 2;
  if (uVar14 < 2) {
    uVar12 = uVar14;
  }
  local_a8 = pdVar1 + uVar12;
  uVar7 = 0;
  uVar9 = uVar14 - uVar12;
  uStack_a0 = uVar7;
  if (uVar9 != 0) {
    do {
      uStack_a0 = uVar7;
      if (local_a8[uVar7] == (detail)0x27) break;
      uVar7 = uVar7 + 1;
      uStack_a0 = uVar9;
    } while (uVar9 != uVar7);
  }
  local_b0 = pdVar18;
  uVar7 = uStack_a0;
  if (uVar9 < uStack_a0) {
    uVar7 = uVar9;
  }
  pdVar2 = local_a8 + uVar7;
  pcVar10 = (char *)(uVar9 - uVar7);
  puVar5 = &local_d0.field_0x14;
  local_d0._p[-1] = '\'';
  pcVar13 = pcVar13 + -1;
  local_d0._buffer[0x13] = '`';
  if (puVar5 == pcVar13) {
    lVar11 = 0;
  }
  else {
    pdVar15 = pdVar2;
    pcVar16 = pcVar10;
    do {
      pcVar17 = (char *)0x0;
      do {
        if (pcVar16 == pcVar17) {
          bVar4 = false;
          pdVar18 = pdVar1 + uVar14;
          goto LAB_00113a16;
        }
        if (pdVar15[(long)pcVar17] != *(detail *)(pcVar13 + (long)pcVar17)) {
          bVar4 = true;
          goto LAB_00113a16;
        }
        pcVar3 = pcVar13 + (long)pcVar17;
        pcVar17 = pcVar17 + 1;
      } while (pcVar3 + 1 != puVar5);
      bVar4 = false;
      pdVar18 = pdVar15;
LAB_00113a16:
      pdVar15 = pdVar15 + 1;
      pcVar16 = pcVar16 + -1;
    } while (bVar4);
    if (pdVar18 == pdVar1 + uVar14) {
      lVar11 = -1;
    }
    else {
      lVar11 = (long)pdVar18 - (long)pdVar2;
    }
  }
  if (lVar11 == -1) {
    local_98 = (detail *)0x0;
  }
  else {
    pcVar16 = puVar5 + ~(ulong)pcVar13 + lVar11;
    pcVar13 = pcVar16;
    if (pcVar10 < pcVar16) {
      pcVar13 = pcVar10;
    }
    uVar14 = (ulong)(pcVar16 < pcVar10);
    local_98 = pdVar2 + (long)pcVar13 + uVar14;
    pcVar10 = pcVar10 + (-uVar14 - (long)pcVar13);
    if (pcVar10 != (char *)0x0) {
      pcVar16 = (char *)0x0;
      do {
        pcStack_90 = pcVar16;
        if ((this + uVar14 + (long)(local_b0 + uVar12 + (long)(pcVar13 + uVar7)))[(long)pcVar16] ==
            (detail)0x27) break;
        pcVar16 = pcVar16 + 1;
        pcStack_90 = pcVar10;
      } while (pcVar10 != pcVar16);
      goto LAB_00113a97;
    }
  }
  pcStack_90 = (char *)0x0;
LAB_00113a97:
  local_78 = (undefined1 *)((long)&local_d0 + (0x13U - (long)local_d0._p));
  pcStack_80 = local_d0._p;
  e._33_7_ = uStack_87;
  e.tag = (char)tag_00;
  e.name._len = uStack_a0;
  e.name._ptr = (char *)local_a8;
  e.enumerator._ptr = (char *)local_98;
  e.enumerator._len = (size_t)pcStack_90;
  e.value._ptr = local_d0._p;
  e.value._len = (size_t)local_78;
  local_88 = tag_00;
  binlog::ToStringVisitor::visit((ToStringVisitor *)tag._len,e);
  return;
}

Assistant:

void visit_tuple(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  tag.remove_prefix(1); // drop (
  tag.remove_suffix(1); // drop )

  const bool skip = visitor.visit(mserialize::Visitor::TupleBegin{tag}, istream);
  if (skip) { return; }

  for (string_view elem_tag = tag_pop(tag); ! elem_tag.empty(); elem_tag = tag_pop(tag))
  {
    visit_impl(full_tag, elem_tag, visitor, istream, max_recursion);
  }

  visitor.visit(mserialize::Visitor::TupleEnd{});
}